

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.h
# Opt level: O2

void __thiscall
Js::IndexPropertyDescriptor::IndexPropertyDescriptor
          (IndexPropertyDescriptor *this,PropertyAttributes attributes,Var getter,Var setter)

{
  this->Attributes = attributes;
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->Getter,getter);
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->Setter,setter);
  return;
}

Assistant:

IndexPropertyDescriptor(PropertyAttributes attributes = PropertyDynamicTypeDefaults,
            Var getter = NULL, Var setter = NULL)
            : Attributes(attributes), Getter(getter), Setter(setter)
        {
        }